

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaSlCrank_dns.c
# Opt level: O3

void PrintHeader(sunrealtype rtol,sunrealtype atol,N_Vector y)

{
  puts("\nidaSlCrank_dns: Slider-Crank DAE serial example problem for IDA");
  puts("Linear solver: DENSE, Jacobian is computed by IDA.");
  printf("Tolerance parameters:  rtol = %g   atol = %g\n",0x3eb0c6f7a0b5ed8d,0xa0b5ed8d);
  puts("-----------------------------------------------------------------------");
  printf("  t            y1          y2           y3");
  puts("      | nst  k      h");
  puts("-----------------------------------------------------------------------");
  return;
}

Assistant:

static void PrintHeader(sunrealtype rtol, sunrealtype atol, N_Vector y)
{
  printf("\nidaSlCrank_dns: Slider-Crank DAE serial example problem for IDA\n");
  printf("Linear solver: DENSE, Jacobian is computed by IDA.\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("Tolerance parameters:  rtol = %Lg   atol = %Lg\n", rtol, atol);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("Tolerance parameters:  rtol = %g   atol = %g\n", rtol, atol);
#else
  printf("Tolerance parameters:  rtol = %g   atol = %g\n", rtol, atol);
#endif
  printf("---------------------------------------------------------------------"
         "--\n");
  printf("  t            y1          y2           y3");
  printf("      | nst  k      h\n");
  printf("---------------------------------------------------------------------"
         "--\n");
}